

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedGroup::ByteSizeLong
          (TestParsingMergeLite_RepeatedGroup *this)

{
  bool bVar1;
  int desired;
  uint32_t *puVar2;
  long lVar3;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestParsingMergeLite_RepeatedGroup *this_;
  TestParsingMergeLite_RepeatedGroup *this_local;
  
  sStack_20 = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar2 & 1) != 0) {
    sStack_20 = google::protobuf::internal::WireFormatLite::
                MessageSize<proto2_unittest::TestAllTypesLite>
                          ((this->field_0)._impl_.repeated_group_all_types_);
    sStack_20 = sStack_20 + 2;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    sStack_20 = lVar3 + sStack_20;
  }
  desired = google::protobuf::internal::ToCachedSize(sStack_20);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,desired);
  return sStack_20;
}

Assistant:

::size_t TestParsingMergeLite_RepeatedGroup::ByteSizeLong() const {
  const TestParsingMergeLite_RepeatedGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite.RepeatedGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // .proto2_unittest.TestAllTypesLite repeated_group_all_types = 21;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.repeated_group_all_types_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}